

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O3

OneofGeneratorInfo * __thiscall
google::protobuf::compiler::java::Context::GetOneofGeneratorInfo
          (Context *this,OneofDescriptor *oneof)

{
  ushort *puVar1;
  bool bVar2;
  pointer prVar3;
  string_view str;
  string_view v;
  const_iterator it;
  iterator local_38;
  OneofDescriptor *local_28;
  iterator local_20;
  
  local_28 = oneof;
  local_20 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::OneofDescriptor_const*,google::protobuf::compiler::java::OneofGeneratorInfo>,absl::lts_20250127::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::OneofDescriptor_const*const,google::protobuf::compiler::java::OneofGeneratorInfo>>>
             ::find<google::protobuf::OneofDescriptor_const*>
                       ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::OneofDescriptor_const*,google::protobuf::compiler::java::OneofGeneratorInfo>,absl::lts_20250127::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::OneofDescriptor_const*const,google::protobuf::compiler::java::OneofGeneratorInfo>>>
                         *)&this->oneof_generator_info_map_,&local_28);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::OneofDescriptor_*,_google::protobuf::compiler::java::OneofGeneratorInfo>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::OneofDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::OneofDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::OneofDescriptor_*const,_google::protobuf::compiler::java::OneofGeneratorInfo>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::OneofDescriptor_*,_google::protobuf::compiler::java::OneofGeneratorInfo>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::OneofDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::OneofDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::OneofDescriptor_*const,_google::protobuf::compiler::java::OneofGeneratorInfo>_>_>
              *)&this->oneof_generator_info_map_);
  local_38.ctrl_ = (ctrl_t *)0x0;
  bVar2 = absl::lts_20250127::container_internal::operator==(&local_20,&local_38);
  if (!bVar2) {
    prVar3 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::OneofDescriptor_*,_google::protobuf::compiler::java::OneofGeneratorInfo>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::OneofDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::OneofDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::OneofDescriptor_*const,_google::protobuf::compiler::java::OneofGeneratorInfo>_>_>
             ::iterator::operator->(&local_20);
    return &prVar3->second;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/context.cc"
             ,199);
  str._M_str = "Can not find OneofGeneratorInfo for oneof: ";
  str._M_len = 0x2b;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
            ((LogMessage *)&local_38,str);
  puVar1 = (ushort *)(local_28->all_names_).payload_;
  v._M_len = (ulong)*puVar1;
  v._M_str = (char *)((long)puVar1 + ~v._M_len);
  absl::lts_20250127::log_internal::LogMessage::operator<<((LogMessage *)&local_38,v);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_38);
}

Assistant:

const OneofGeneratorInfo* Context::GetOneofGeneratorInfo(
    const OneofDescriptor* oneof) const {
  auto it = oneof_generator_info_map_.find(oneof);
  if (it == oneof_generator_info_map_.end()) {
    ABSL_LOG(FATAL) << "Can not find OneofGeneratorInfo for oneof: "
                    << oneof->name();
  }
  return &it->second;
}